

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost2012_paramgen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  int *piVar2;
  EC_KEY *key;
  EVP_PKEY *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  int result;
  EC_KEY *ec;
  gost_pmeth_data *data;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  uint local_4;
  
  piVar2 = (int *)EVP_PKEY_CTX_get_data(in_RDI);
  if ((piVar2 == (int *)0x0) || (*piVar2 == 0)) {
    ERR_GOST_error(0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    return 0;
  }
  key = EC_KEY_new();
  iVar1 = fill_GOST_EC_params((EC_KEY *)ctx,pkey._4_4_);
  if (iVar1 == 0) {
    EC_KEY_free(key);
    return 0;
  }
  iVar1 = *piVar2;
  if (5 < iVar1 - 0x347U) {
    if (iVar1 - 0x3e5U < 3) {
LAB_00117cc7:
      iVar1 = EVP_PKEY_assign(in_RSI,0x3d4,key);
      local_4 = (uint)(iVar1 != 0);
      goto LAB_00117d21;
    }
    if (iVar1 != 0x47c) {
      if (iVar1 == 0x47d) goto LAB_00117cc7;
      if (2 < iVar1 - 0x4a0U) {
        local_4 = 0;
        goto LAB_00117d21;
      }
    }
  }
  iVar1 = EVP_PKEY_assign(in_RSI,0x3d3,key);
  local_4 = (uint)(iVar1 != 0);
LAB_00117d21:
  if (local_4 == 0) {
    EC_KEY_free(key);
  }
  return local_4;
}

Assistant:

static int pkey_gost2012_paramgen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey)
{
    struct gost_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    EC_KEY *ec;
    int result = 0;

    if (!data || data->sign_param_nid == NID_undef) {
        GOSTerr(GOST_F_PKEY_GOST2012_PARAMGEN, GOST_R_NO_PARAMETERS_SET);
        return 0;
    }

    ec = EC_KEY_new();
    if (!fill_GOST_EC_params(ec, data->sign_param_nid)) {
        EC_KEY_free(ec);
        return 0;
    }

    switch (data->sign_param_nid) {
    case NID_id_tc26_gost_3410_2012_512_paramSetA:
    case NID_id_tc26_gost_3410_2012_512_paramSetB:
    case NID_id_tc26_gost_3410_2012_512_paramSetC:
    case NID_id_tc26_gost_3410_2012_512_paramSetTest:
        result =
            (EVP_PKEY_assign(pkey, NID_id_GostR3410_2012_512, ec)) ? 1 : 0;
        break;

    case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
    case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
    case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
    case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
    case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
    case NID_id_GostR3410_2001_TestParamSet:
    case NID_id_tc26_gost_3410_2012_256_paramSetA:
    case NID_id_tc26_gost_3410_2012_256_paramSetB:
    case NID_id_tc26_gost_3410_2012_256_paramSetC:
    case NID_id_tc26_gost_3410_2012_256_paramSetD:
        result =
            (EVP_PKEY_assign(pkey, NID_id_GostR3410_2012_256, ec)) ? 1 : 0;
        break;
    default:
        result = 0;
        break;
    }

    if (result == 0)
        EC_KEY_free(ec);

    return result;
}